

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusplatformmenu_p.cpp
# Opt level: O0

int __thiscall QDBusPlatformMenu::qt_metacall(QDBusPlatformMenu *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  void **in_stack_00000028;
  int in_stack_00000030;
  Call in_stack_00000034;
  QObject *in_stack_00000038;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = QPlatformMenu::qt_metacall
                    ((QPlatformMenu *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (Call)((ulong)in_RDI >> 0x20),(int)in_RDI,(void **)CONCAT44(in_ESI,in_EDX));
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 3) {
        qt_static_metacall(in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_00000028);
      }
      iVar1 = iVar1 + -3;
    }
    if (in_ESI == 7) {
      if (iVar1 < 3) {
        qt_static_metacall(in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_00000028);
      }
      iVar1 = iVar1 + -3;
    }
  }
  return iVar1;
}

Assistant:

int QDBusPlatformMenu::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QPlatformMenu::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 3)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 3)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    return _id;
}